

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_manager.cpp
# Opt level: O2

void __thiscall
duckdb::LogManager::LogManager(LogManager *this,DatabaseInstance *db,LogConfig *config_p)

{
  InMemoryLogStorage *in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::InMemoryLogStorage_*,_false> local_28;
  
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  (this->super_enable_shared_from_this<duckdb::LogManager>).__weak_this_.internal.
  super___weak_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<duckdb::LogManager>).__weak_this_.internal.
  super___weak_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_28._M_head_impl = in_RAX;
  LogConfig::LogConfig(&this->config,config_p);
  (this->log_storage).internal.super___shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->next_registered_logging_context_index = 0;
  (this->global_logger).super_unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
  super___uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
  super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl = (Logger *)0x0;
  (this->log_storage).internal.super___shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->registered_log_storages)._M_h._M_buckets =
       &(this->registered_log_storages)._M_h._M_single_bucket;
  (this->registered_log_storages)._M_h._M_bucket_count = 1;
  (this->registered_log_storages)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->registered_log_storages)._M_h._M_element_count = 0;
  (this->registered_log_storages)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->registered_log_storages)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->registered_log_storages)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  make_uniq<duckdb::InMemoryLogStorage,duckdb::DatabaseInstance&>((duckdb *)&local_28,db);
  shared_ptr<duckdb::LogStorage,_true>::
  operator=<duckdb::InMemoryLogStorage,_std::default_delete<duckdb::InMemoryLogStorage>,_true,_0>
            (&this->log_storage,
             (unique_ptr<duckdb::InMemoryLogStorage,_std::default_delete<duckdb::InMemoryLogStorage>,_true>
              *)&local_28);
  if (local_28._M_head_impl != (InMemoryLogStorage *)0x0) {
    (*((local_28._M_head_impl)->super_LogStorage)._vptr_LogStorage[1])();
  }
  return;
}

Assistant:

LogManager::LogManager(DatabaseInstance &db, LogConfig config_p) : config(std::move(config_p)) {
	log_storage = make_uniq<InMemoryLogStorage>(db);
}